

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeAddWindow(ImGuiDockNode *node,ImGuiWindow_conflict *window,_Bool add_to_tab_bar)

{
  int *piVar1;
  ushort uVar2;
  ImGuiID IVar3;
  ImGuiDockNode *node_00;
  ImGuiWindow_conflict *pIVar4;
  ImGuiWindow_conflict **ppIVar5;
  int iVar6;
  ImGuiWindow_conflict **__dest;
  ushort uVar7;
  int iVar8;
  ImGuiTabBar *tab_bar;
  int iVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  
  node_00 = window->DockNode;
  if (node_00 != (ImGuiDockNode *)0x0) {
    if (node_00->ID == node->ID) {
      __assert_fail("window->DockNode->ID != node->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x34ce,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
    DockNodeRemoveWindow(node_00,window,0);
    if ((window->DockNode != (ImGuiDockNode *)0x0) &&
       (window->DockNodeAsHost != (ImGuiDockNode *)0x0)) {
      __assert_fail("window->DockNode == __null || window->DockNodeAsHost == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x34d1,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
  }
  iVar6 = (node->Windows).Size;
  if (iVar6 == 1 && node->HostWindow == (ImGuiWindow_conflict *)0x0) {
    pIVar4 = *(node->Windows).Data;
    iVar6 = 1;
    if (pIVar4->WasActive == false) {
      pIVar4->Hidden = true;
      pIVar4->HiddenFramesCanSkipItems = '\x02' - pIVar4->Active;
    }
  }
  if (iVar6 == (node->Windows).Capacity) {
    if (iVar6 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar6 / 2 + iVar6;
    }
    iVar9 = iVar6 + 1;
    if (iVar6 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiWindow_conflict **)
             (*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
    ppIVar5 = (node->Windows).Data;
    if (ppIVar5 != (ImGuiWindow_conflict **)0x0) {
      memcpy(__dest,ppIVar5,(long)(node->Windows).Size << 3);
      ppIVar5 = (node->Windows).Data;
      if ((ppIVar5 != (ImGuiWindow_conflict **)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
    }
    (node->Windows).Data = __dest;
    (node->Windows).Capacity = iVar9;
    iVar6 = (node->Windows).Size;
  }
  else {
    __dest = (node->Windows).Data;
  }
  __dest[iVar6] = window;
  iVar6 = (node->Windows).Size;
  (node->Windows).Size = iVar6 + 1;
  node->field_0xbe = node->field_0xbe | 2;
  window->DockNode = node;
  window->DockId = node->ID;
  window->field_0x3e1 = window->field_0x3e1 & 0xf6 | 0 < iVar6;
  if (((node->HostWindow == (ImGuiWindow_conflict *)0x0) &&
      (node->ParentNode == (ImGuiDockNode *)0x0)) && ((node->MergedFlags & 0x400U) == 0)) {
    uVar2 = *(ushort *)&node->field_0xbc;
    bVar11 = (uVar2 & 7) == 0;
    uVar7 = uVar2 | 2;
    if (!bVar11) {
      uVar7 = uVar2;
    }
    bVar12 = (uVar7 & 0x38) == 0;
    uVar2 = uVar7 | 0x10;
    if (!bVar12) {
      uVar2 = uVar7;
    }
    if (!(bool)(~(bVar12 || bVar11) & (uVar2 & 0x1c0) != 0)) {
      uVar7 = uVar2 | 0x80;
      if ((uVar2 & 0x1c0) != 0) {
        uVar7 = uVar2;
      }
      *(ushort *)&node->field_0xbc = uVar7;
    }
  }
  if (add_to_tab_bar) {
    tab_bar = node->TabBar;
    if (tab_bar == (ImGuiTabBar *)0x0) {
      DockNodeAddTabBar(node);
      IVar3 = node->SelectedTabId;
      tab_bar = node->TabBar;
      tab_bar->NextSelectedTabId = IVar3;
      tab_bar->SelectedTabId = IVar3;
      if (1 < (node->Windows).Size) {
        lVar10 = 0;
        do {
          TabBarAddTab(node->TabBar,0,(ImGuiWindow *)(node->Windows).Data[lVar10]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < (long)(node->Windows).Size + -1);
        tab_bar = node->TabBar;
      }
    }
    TabBarAddTab(tab_bar,0x400000,(ImGuiWindow *)window);
  }
  DockNodeUpdateVisibleFlag(node);
  if (node->HostWindow != (ImGuiWindow_conflict *)0x0) {
    UpdateWindowParentAndRootLinks(window,window->Flags | 0x1000000,node->HostWindow);
    return;
  }
  return;
}

Assistant:

static void ImGui::DockNodeAddWindow(ImGuiDockNode* node, ImGuiWindow* window, bool add_to_tab_bar)
{
    ImGuiContext& g = *GImGui; (void)g;
    if (window->DockNode)
    {
        // Can overwrite an existing window->DockNode (e.g. pointing to a disabled DockSpace node)
        IM_ASSERT(window->DockNode->ID != node->ID);
        DockNodeRemoveWindow(window->DockNode, window, 0);
    }
    IM_ASSERT(window->DockNode == NULL || window->DockNodeAsHost == NULL);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeAddWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    // If more than 2 windows appeared on the same frame leading to the creation of a new hosting window,
    // we'll hide windows until the host window is ready. Hide the 1st window after its been output (so it is not visible for one frame).
    // We will call DockNodeHideWindowDuringHostWindowCreation() on ourselves in Begin()
    if (node->HostWindow == NULL && node->Windows.Size == 1 && node->Windows[0]->WasActive == false)
        DockNodeHideWindowDuringHostWindowCreation(node->Windows[0]);

    node->Windows.push_back(window);
    node->WantHiddenTabBarUpdate = true;
    window->DockNode = node;
    window->DockId = node->ID;
    window->DockIsActive = (node->Windows.Size > 1);
    window->DockTabWantClose = false;

    // When reactivating a node with one or two loose window, the window pos/size/viewport are authoritative over the node storage.
    // In particular it is important we init the viewport from the first window so we don't create two viewports and drop one.
    if (node->HostWindow == NULL && node->IsFloatingNode())
    {
        if (node->AuthorityForPos == ImGuiDataAuthority_Auto)
            node->AuthorityForPos = ImGuiDataAuthority_Window;
        if (node->AuthorityForSize == ImGuiDataAuthority_Auto)
            node->AuthorityForSize = ImGuiDataAuthority_Window;
        if (node->AuthorityForViewport == ImGuiDataAuthority_Auto)
            node->AuthorityForViewport = ImGuiDataAuthority_Window;
    }

    // Add to tab bar if requested
    if (add_to_tab_bar)
    {
        if (node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            node->TabBar->SelectedTabId = node->TabBar->NextSelectedTabId = node->SelectedTabId;

            // Add existing windows
            for (int n = 0; n < node->Windows.Size - 1; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }
        TabBarAddTab(node->TabBar, ImGuiTabItemFlags_Unsorted, window);
    }

    DockNodeUpdateVisibleFlag(node);

    // Update this without waiting for the next time we Begin() in the window, so our host window will have the proper title bar color on its first frame.
    if (node->HostWindow)
        UpdateWindowParentAndRootLinks(window, window->Flags | ImGuiWindowFlags_ChildWindow, node->HostWindow);
}